

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

void duckdb::ApproxQuantileOperation::
     Operation<duckdb::dtime_tz_t,duckdb::ApproxQuantileState,duckdb::ApproxQuantileScalarOperation>
               (ApproxQuantileState *state,dtime_tz_t *input,AggregateUnaryInput *unary_input)

{
  ulong uVar1;
  long *in_RDI;
  double dVar2;
  double val;
  void *in_stack_ffffffffffffffc8;
  TDigest *in_stack_ffffffffffffffd0;
  
  dVar2 = ApproxQuantileCoding::Encode<duckdb::dtime_tz_t,double>
                    ((dtime_tz_t *)in_stack_ffffffffffffffd0);
  uVar1 = duckdb::Value::DoubleIsFinite(dVar2);
  if ((uVar1 & 1) != 0) {
    if (*in_RDI == 0) {
      in_stack_ffffffffffffffc8 = operator_new(0x80);
      duckdb_tdigest::TDigest::TDigest(in_stack_ffffffffffffffd0,(Value)in_stack_ffffffffffffffc8);
      *in_RDI = (long)in_stack_ffffffffffffffc8;
    }
    duckdb_tdigest::TDigest::add(in_stack_ffffffffffffffd0,(Value)in_stack_ffffffffffffffc8);
    in_RDI[1] = in_RDI[1] + 1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto val = ApproxQuantileCoding::template Encode<INPUT_TYPE, SAVE_TYPE>(input);
		if (!Value::DoubleIsFinite(val)) {
			return;
		}
		if (!state.h) {
			state.h = new duckdb_tdigest::TDigest(100);
		}
		state.h->add(val);
		state.pos++;
	}